

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O1

DirWatcherGeneric * __thiscall
efsw::DirWatcherGeneric::createDirectory(DirWatcherGeneric *this,string *newdir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  WatcherGeneric *pWVar4;
  FileWatcherImpl *pFVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  bool *pbVar10;
  DirWatcherGeneric *this_00;
  mapped_type *ppDVar11;
  byte bVar12;
  string dir;
  string link;
  string curPath;
  FileInfo fi;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  FileInfo local_78;
  
  FileSystem::dirRemoveSlashAtEnd(newdir);
  pcVar3 = (newdir->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar3,pcVar3 + newdir->_M_string_length);
  FileSystem::fileNameFromPath(&local_78.Filepath,&local_98);
  std::__cxx11::string::operator=((string *)newdir,(string *)&local_78);
  paVar2 = &local_78.Filepath.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Filepath._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.Filepath._M_dataplus._M_p,
                    local_78.Filepath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->DirSnap
                 ,newdir);
  FileSystem::dirAddSlashAtEnd(&local_178);
  FileInfo::FileInfo(&local_78,&local_178);
  bVar6 = FileInfo::isDirectory(&local_78);
  if (((!bVar6) || (bVar6 = FileInfo::isReadable(&local_78), !bVar6)) ||
     (bVar6 = FileSystem::isRemoteFS(&local_178), bVar6)) {
    this_00 = (DirWatcherGeneric *)0x0;
    goto LAB_00115d27;
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,local_178._M_dataplus._M_p,
             local_178._M_dataplus._M_p + local_178._M_string_length);
  FileSystem::getLinkRealPath(&local_158,&local_b8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_158);
  pWVar4 = this->Watch;
  if (iVar8 == 0) {
    paVar1 = &local_138.field_2;
    local_138._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,local_178._M_dataplus._M_p,
               local_178._M_dataplus._M_p + local_178._M_string_length);
    bVar6 = WatcherGeneric::pathInWatches(pWVar4,&local_138);
    if (bVar6) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pFVar5 = this->Watch->WatcherImpl;
      iVar8 = (*pFVar5->_vptr_FileWatcherImpl[10])(pFVar5,&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar1) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((char)iVar8 == '\0') goto LAB_00115f60;
    }
LAB_00115f58:
    this_00 = (DirWatcherGeneric *)0x0;
  }
  else {
    pbVar10 = FileWatcher::followSymlinks(pWVar4->WatcherImpl->mFileWatcher);
    bVar6 = *pbVar10;
    pFVar5 = this->Watch->WatcherImpl;
    iVar8 = (*pFVar5->_vptr_FileWatcherImpl[10])(pFVar5,&local_158);
    bVar12 = 1;
    if ((char)iVar8 == '\0') {
      pWVar4 = this->Watch;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_158._M_dataplus._M_p,
                 local_158._M_dataplus._M_p + local_158._M_string_length);
      bVar7 = WatcherGeneric::pathInWatches(pWVar4,&local_f8);
      if (!bVar7) {
        pFVar5 = this->Watch->WatcherImpl;
        iVar9 = (*pFVar5->_vptr_FileWatcherImpl[9])(pFVar5,&local_118,&local_158);
        bVar12 = (byte)iVar9 ^ 1;
      }
    }
    if (((char)iVar8 == '\0') &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2)) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((bVar12 != 0) || (std::__cxx11::string::_M_assign((string *)&local_178), bVar6 == false))
    goto LAB_00115f58;
LAB_00115f60:
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
    handleAction(this,newdir,1,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    this_00 = (DirWatcherGeneric *)operator_new(0xc0);
    DirWatcherGeneric(this_00,this,this->Watch,&local_178,this->Recursive,false);
    addChilds(this_00,true);
    watch(this_00,false);
    ppDVar11 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::DirWatcherGeneric_*>_>_>
               ::operator[](&this->Directories,newdir);
    *ppDVar11 = this_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
LAB_00115d27:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Filepath._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.Filepath._M_dataplus._M_p,
                    local_78.Filepath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  return this_00;
}

Assistant:

DirWatcherGeneric * DirWatcherGeneric::createDirectory( std::string newdir )
{
	FileSystem::dirRemoveSlashAtEnd( newdir );
	newdir = FileSystem::fileNameFromPath( newdir );

	DirWatcherGeneric * dw = NULL;

	/// Check if the directory is a symbolic link
	std::string dir( DirSnap.DirectoryInfo.Filepath + newdir );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() || !fi.isReadable() || FileSystem::isRemoteFS( dir ) )
	{
		return NULL;
	}

	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );
	bool skip = false;

	if ( "" != link )
	{
		/// Avoid adding symlinks directories if it's now enabled
		if ( !Watch->WatcherImpl->mFileWatcher->followSymlinks() )
		{
			skip = true;
		}

		/// If it's a symlink check if the realpath exists as a watcher, or
		/// if the path is outside the current dir
		if ( Watch->WatcherImpl->pathInWatches( link ) || Watch->pathInWatches( link ) || !Watch->WatcherImpl->linkAllowed( curPath, link ) )
		{
			skip = true;
		}
		else
		{
			dir = link;
		}
	}
	else
	{
		if ( Watch->pathInWatches( dir ) || Watch->WatcherImpl->pathInWatches( dir ) )
		{
			skip = true;
		}
	}

	if ( !skip )
	{
		handleAction( newdir, Actions::Add );

		/// Creates the new directory watcher of the subfolder and check for new files
		dw = new DirWatcherGeneric( this, Watch, dir, Recursive );
		
		dw->addChilds();

		dw->watch();

		/// Add it to the list of directories
		Directories[ newdir ] = dw;
	}

	return dw;
}